

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rkd_tree_hh_data.hpp
# Opt level: O0

point<float,_784UL> * pico_tree::internal::random_normal<float,784ul>(size_t dim)

{
  scalar_type *psVar1;
  ulong in_RSI;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *in_RDI;
  size_t i;
  normal_distribution<float> gaussian;
  mt19937 e;
  random_device rd;
  result_type in_stack_ffffffffffffd898;
  result_type in_stack_ffffffffffffd89c;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *this;
  undefined8 local_2740;
  random_device *in_stack_ffffffffffffd8e0;
  
  this = in_RDI;
  std::random_device::random_device(in_stack_ffffffffffffd8e0);
  std::random_device::operator()((random_device *)0x10f485);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine(this,CONCAT44(in_stack_ffffffffffffd89c,in_stack_ffffffffffffd898));
  std::normal_distribution<float>::normal_distribution
            ((normal_distribution<float> *)this,in_stack_ffffffffffffd89c,in_stack_ffffffffffffd898)
  ;
  point<float,_784UL>::from_size((size_t)this);
  for (local_2740 = 0; local_2740 < in_RSI; local_2740 = local_2740 + 1) {
    in_stack_ffffffffffffd89c =
         ::std::normal_distribution<float>::operator()
                   ((normal_distribution<float> *)this,
                    (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                     *)CONCAT44(in_stack_ffffffffffffd89c,in_stack_ffffffffffffd898));
    psVar1 = point<float,_784UL>::operator[]
                       ((point<float,_784UL> *)this,
                        CONCAT44(in_stack_ffffffffffffd89c,in_stack_ffffffffffffd898));
    *psVar1 = in_stack_ffffffffffffd89c;
  }
  point<float,_784UL>::normalize((point<float,_784UL> *)in_stack_ffffffffffffd8e0);
  std::random_device::~random_device((random_device *)0x10f558);
  return (point<float,_784UL> *)in_RDI;
}

Assistant:

inline point<Scalar_, Dim_> random_normal(size_t dim) {
  std::random_device rd;
  std::mt19937 e(rd());
  std::normal_distribution<Scalar_> gaussian(Scalar_(0), Scalar_(1));

  point<Scalar_, Dim_> v = point<Scalar_, Dim_>::from_size(dim);

  for (size_t i = 0; i < dim; ++i) {
    v[i] = gaussian(e);
  }

  v.normalize();

  return v;
}